

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::FullyConnectedLayer::FullyConnectedLayer
          (FullyConnectedLayer *this,Array *weights,Array *bias,Activation *af)

{
  size_t sVar1;
  size_t sVar2;
  valarray<float> *pvVar3;
  Activation *af_local;
  Array *bias_local;
  Array *weights_local;
  FullyConnectedLayer *this_local;
  
  ABackpropLayer::ABackpropLayer(&this->super_ABackpropLayer);
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)&PTR_tag_abi_cxx11__002ba348;
  sVar1 = std::valarray<float>::size(weights);
  sVar2 = std::valarray<float>::size(bias);
  this->nInputs = sVar1 / sVar2;
  sVar1 = std::valarray<float>::size(bias);
  this->nOutputs = sVar1;
  pvVar3 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar3,weights);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->weights,pvVar3);
  pvVar3 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar3,bias);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->bias,pvVar3);
  this->activationFunction = af;
  std::valarray<float>::valarray(&this->inducedLocalField,this->nOutputs);
  std::valarray<float>::valarray(&this->activationGrad,this->nOutputs);
  std::valarray<float>::valarray(&this->localGrad,this->nOutputs);
  pvVar3 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar3,this->nInputs * this->nOutputs);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->weightSensitivity,pvVar3);
  pvVar3 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar3,this->nOutputs);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->biasSensitivity,pvVar3);
  std::valarray<float>::valarray(&this->propagatedErrors,this->nInputs);
  std::shared_ptr<notch::core::ALearningPolicy>::shared_ptr(&this->policy);
  return;
}

Assistant:

FullyConnectedLayer(Array &&weights, Array &&bias,
                        const Activation &af)
        : nInputs(weights.size()/bias.size()), nOutputs(bias.size()),
          weights(new Array(weights)), bias(new Array(bias)),
          activationFunction(&af), inducedLocalField(nOutputs),
          activationGrad(nOutputs), localGrad(nOutputs),
          weightSensitivity(new Array(nInputs * nOutputs)),
          biasSensitivity(new Array(nOutputs)),
          propagatedErrors(nInputs) {}